

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  undefined1 auVar14 [16];
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined4 uVar18;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar36;
  float fVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar42;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  undefined1 auVar46 [16];
  float fVar50;
  float fVar55;
  float fVar56;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar59;
  float fVar65;
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar66;
  float fVar68;
  float fVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar70;
  float fVar74;
  float fVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  float fVar98;
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar122 [16];
  undefined1 local_b09;
  long local_b08;
  int local_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  ulong local_ae8;
  float fStack_ae0;
  float fStack_adc;
  Scene *local_ad8;
  float fStack_ad0;
  float fStack_acc;
  ulong local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  NodeRef *local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  ulong local_a30;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_9c8;
  uint uStack_9c4;
  uint uStack_9c0;
  uint uStack_9bc;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar14 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar41 = ray->tfar, 0.0 <= fVar41)) {
    local_aa8 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar10 = (ray->org).field_0.m128[0];
    fVar11 = (ray->org).field_0.m128[1];
    fVar97 = (ray->org).field_0.m128[2];
    aVar5 = (ray->dir).field_0.field_1;
    auVar61._4_4_ = -(uint)(ABS(aVar5.y) < 1e-18);
    auVar61._0_4_ = -(uint)(ABS(aVar5.x) < 1e-18);
    auVar61._8_4_ = -(uint)(ABS(aVar5.z) < 1e-18);
    auVar61._12_4_ = -(uint)(ABS(aVar5.field_3.w) < 1e-18);
    auVar60 = divps(_DAT_01feca10,(undefined1  [16])aVar5);
    auVar61 = blendvps(auVar60,_DAT_0201c930,auVar61);
    fVar69 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar27 = 0.0;
    if (0.0 <= fVar69) {
      fVar27 = fVar69;
    }
    fVar70 = auVar61._0_4_ * 0.99999964;
    fVar74 = auVar61._4_4_ * 0.99999964;
    fVar75 = auVar61._8_4_ * 0.99999964;
    fVar58 = auVar61._0_4_ * 1.0000004;
    fVar65 = auVar61._4_4_ * 1.0000004;
    fVar67 = auVar61._8_4_ * 1.0000004;
    local_ab0 = (ulong)(fVar70 < 0.0) << 4;
    local_ab8 = (ulong)(fVar74 < 0.0) << 4 | 0x20;
    local_ac0 = (ulong)(fVar75 < 0.0) << 4 | 0x40;
    uVar24 = local_ab0 ^ 0x10;
    uVar25 = local_ab8 ^ 0x10;
    uVar23 = local_ac0 ^ 0x10;
    fVar69 = fVar97;
    fVar28 = fVar97;
    fVar36 = fVar97;
    fVar37 = fVar27;
    fVar38 = fVar27;
    fVar39 = fVar27;
    fVar40 = fVar41;
    fVar50 = fVar41;
    fVar55 = fVar41;
    local_aa0 = uVar23;
    local_a98 = uVar25;
    local_a90 = uVar24;
    local_a88 = fVar27;
    fStack_a84 = fVar27;
    fStack_a80 = fVar27;
    fStack_a7c = fVar27;
    local_a78 = fVar97;
    fStack_a74 = fVar97;
    fStack_a70 = fVar97;
    fStack_a6c = fVar97;
    local_a68 = fVar41;
    fStack_a64 = fVar41;
    fStack_a60 = fVar41;
    fStack_a5c = fVar41;
    do {
      pNVar19 = stack;
      if (local_aa8 == pNVar19) {
        return;
      }
      sVar22 = local_aa8[-1].ptr;
      local_aa8 = local_aa8 + -1;
      do {
        if ((sVar22 & 8) == 0) {
          pfVar1 = (float *)(sVar22 + 0x20 + local_ab0);
          auVar29._0_4_ = (*pfVar1 - fVar10) * fVar70;
          auVar29._4_4_ = (pfVar1[1] - fVar10) * fVar70;
          auVar29._8_4_ = (pfVar1[2] - fVar10) * fVar70;
          auVar29._12_4_ = (pfVar1[3] - fVar10) * fVar70;
          pfVar1 = (float *)(sVar22 + 0x20 + local_ab8);
          auVar43._0_4_ = (*pfVar1 - fVar11) * fVar74;
          auVar43._4_4_ = (pfVar1[1] - fVar11) * fVar74;
          auVar43._8_4_ = (pfVar1[2] - fVar11) * fVar74;
          auVar43._12_4_ = (pfVar1[3] - fVar11) * fVar74;
          auVar61 = maxps(auVar29,auVar43);
          pfVar1 = (float *)(sVar22 + 0x20 + local_ac0);
          auVar44._0_4_ = (*pfVar1 - fVar97) * fVar75;
          auVar44._4_4_ = (pfVar1[1] - fVar69) * fVar75;
          auVar44._8_4_ = (pfVar1[2] - fVar28) * fVar75;
          auVar44._12_4_ = (pfVar1[3] - fVar36) * fVar75;
          auVar60._4_4_ = fVar37;
          auVar60._0_4_ = fVar27;
          auVar60._8_4_ = fVar38;
          auVar60._12_4_ = fVar39;
          auVar60 = maxps(auVar44,auVar60);
          auVar61 = maxps(auVar61,auVar60);
          pfVar1 = (float *)(sVar22 + 0x20 + uVar24);
          auVar45._0_4_ = (*pfVar1 - fVar10) * fVar58;
          auVar45._4_4_ = (pfVar1[1] - fVar10) * fVar58;
          auVar45._8_4_ = (pfVar1[2] - fVar10) * fVar58;
          auVar45._12_4_ = (pfVar1[3] - fVar10) * fVar58;
          pfVar1 = (float *)(sVar22 + 0x20 + uVar25);
          auVar51._0_4_ = (*pfVar1 - fVar11) * fVar65;
          auVar51._4_4_ = (pfVar1[1] - fVar11) * fVar65;
          auVar51._8_4_ = (pfVar1[2] - fVar11) * fVar65;
          auVar51._12_4_ = (pfVar1[3] - fVar11) * fVar65;
          auVar60 = minps(auVar45,auVar51);
          pfVar1 = (float *)(sVar22 + 0x20 + uVar23);
          auVar52._0_4_ = (*pfVar1 - fVar97) * fVar67;
          auVar52._4_4_ = (pfVar1[1] - fVar69) * fVar67;
          auVar52._8_4_ = (pfVar1[2] - fVar28) * fVar67;
          auVar52._12_4_ = (pfVar1[3] - fVar36) * fVar67;
          auVar53._4_4_ = fVar40;
          auVar53._0_4_ = fVar41;
          auVar53._8_4_ = fVar50;
          auVar53._12_4_ = fVar55;
          auVar53 = minps(auVar52,auVar53);
          auVar60 = minps(auVar60,auVar53);
          auVar30._4_4_ = -(uint)(auVar61._4_4_ <= auVar60._4_4_);
          auVar30._0_4_ = -(uint)(auVar61._0_4_ <= auVar60._0_4_);
          auVar30._8_4_ = -(uint)(auVar61._8_4_ <= auVar60._8_4_);
          auVar30._12_4_ = -(uint)(auVar61._12_4_ <= auVar60._12_4_);
          uVar18 = movmskps((int)unaff_RBX,auVar30);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar18);
        }
        if ((sVar22 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar15 = 4;
          }
          else {
            uVar21 = sVar22 & 0xfffffffffffffff0;
            lVar17 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            iVar15 = 0;
            sVar22 = *(size_t *)(uVar21 + lVar17 * 8);
            uVar20 = unaff_RBX - 1 & unaff_RBX;
            if (uVar20 != 0) {
              local_aa8->ptr = sVar22;
              lVar17 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              uVar16 = uVar20 - 1;
              while( true ) {
                local_aa8 = local_aa8 + 1;
                sVar22 = *(size_t *)(uVar21 + lVar17 * 8);
                uVar16 = uVar16 & uVar20;
                if (uVar16 == 0) break;
                local_aa8->ptr = sVar22;
                lVar17 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                uVar20 = uVar16 - 1;
              }
              iVar15 = 0;
            }
          }
        }
        else {
          iVar15 = 6;
        }
      } while (iVar15 == 0);
      if (iVar15 == 6) {
        iVar15 = 0;
        local_ae8 = (ulong)((uint)sVar22 & 0xf) - 8;
        bVar26 = local_ae8 != 0;
        if (bVar26) {
          uVar21 = sVar22 & 0xfffffffffffffff0;
          local_a30 = 0;
          do {
            local_b08 = local_a30 * 0xb0;
            fVar41 = (ray->org).field_0.m128[0];
            fVar69 = (ray->org).field_0.m128[1];
            fVar97 = (ray->org).field_0.m128[2];
            pfVar1 = (float *)(uVar21 + local_b08);
            pfVar2 = (float *)(uVar21 + 0x10 + local_b08);
            pfVar3 = (float *)(uVar21 + 0x20 + local_b08);
            pfVar4 = (float *)(uVar21 + 0x30 + local_b08);
            fVar120 = *pfVar1 - fVar41;
            fVar123 = pfVar1[1] - fVar41;
            fVar125 = pfVar1[2] - fVar41;
            fVar126 = pfVar1[3] - fVar41;
            fVar100 = *pfVar2 - fVar69;
            fVar101 = pfVar2[1] - fVar69;
            fVar102 = pfVar2[2] - fVar69;
            fVar103 = pfVar2[3] - fVar69;
            fVar108 = *pfVar3 - fVar97;
            fVar110 = pfVar3[1] - fVar97;
            fVar112 = pfVar3[2] - fVar97;
            fVar114 = pfVar3[3] - fVar97;
            fVar27 = *pfVar4 - fVar41;
            fVar36 = pfVar4[1] - fVar41;
            fVar38 = pfVar4[2] - fVar41;
            fVar40 = pfVar4[3] - fVar41;
            pfVar1 = (float *)(uVar21 + 0x40 + local_b08);
            fVar50 = *pfVar1 - fVar69;
            fVar55 = pfVar1[1] - fVar69;
            fVar56 = pfVar1[2] - fVar69;
            fVar57 = pfVar1[3] - fVar69;
            pfVar1 = (float *)(uVar21 + 0x50 + local_b08);
            fVar76 = *pfVar1 - fVar97;
            fVar77 = pfVar1[1] - fVar97;
            fVar78 = pfVar1[2] - fVar97;
            fVar79 = pfVar1[3] - fVar97;
            pfVar1 = (float *)(uVar21 + 0x60 + local_b08);
            fVar28 = *pfVar1 - fVar41;
            fVar37 = pfVar1[1] - fVar41;
            fVar39 = pfVar1[2] - fVar41;
            fVar41 = pfVar1[3] - fVar41;
            pfVar1 = (float *)(uVar21 + 0x70 + local_b08);
            fVar59 = *pfVar1 - fVar69;
            fVar66 = pfVar1[1] - fVar69;
            fVar68 = pfVar1[2] - fVar69;
            fVar69 = pfVar1[3] - fVar69;
            pfVar1 = (float *)(uVar21 + 0x80 + local_b08);
            fVar92 = *pfVar1 - fVar97;
            fVar94 = pfVar1[1] - fVar97;
            fVar96 = pfVar1[2] - fVar97;
            fVar97 = pfVar1[3] - fVar97;
            fVar85 = fVar28 - fVar120;
            fVar88 = fVar37 - fVar123;
            fVar89 = fVar39 - fVar125;
            fVar90 = fVar41 - fVar126;
            fVar116 = fVar59 - fVar100;
            fVar117 = fVar66 - fVar101;
            fVar118 = fVar68 - fVar102;
            fVar119 = fVar69 - fVar103;
            fVar104 = fVar92 - fVar108;
            fVar105 = fVar94 - fVar110;
            fVar106 = fVar96 - fVar112;
            fVar107 = fVar97 - fVar114;
            fVar91 = (ray->dir).field_0.m128[0];
            fStack_ad0 = (ray->dir).field_0.m128[1];
            fVar95 = (ray->dir).field_0.m128[2];
            fVar42 = (fVar116 * (fVar108 + fVar92) - (fVar100 + fVar59) * fVar104) * fVar91 +
                     ((fVar120 + fVar28) * fVar104 - (fVar108 + fVar92) * fVar85) * fStack_ad0 +
                     (fVar85 * (fVar100 + fVar59) - (fVar120 + fVar28) * fVar116) * fVar95;
            fVar47 = (fVar117 * (fVar110 + fVar94) - (fVar101 + fVar66) * fVar105) * fVar91 +
                     ((fVar123 + fVar37) * fVar105 - (fVar110 + fVar94) * fVar88) * fStack_ad0 +
                     (fVar88 * (fVar101 + fVar66) - (fVar123 + fVar37) * fVar117) * fVar95;
            fVar48 = (fVar118 * (fVar112 + fVar96) - (fVar102 + fVar68) * fVar106) * fVar91 +
                     ((fVar125 + fVar39) * fVar106 - (fVar112 + fVar96) * fVar89) * fStack_ad0 +
                     (fVar89 * (fVar102 + fVar68) - (fVar125 + fVar39) * fVar118) * fVar95;
            fVar49 = (fVar119 * (fVar114 + fVar97) - (fVar103 + fVar69) * fVar107) * fVar91 +
                     ((fVar126 + fVar41) * fVar107 - (fVar114 + fVar97) * fVar90) * fStack_ad0 +
                     (fVar90 * (fVar103 + fVar69) - (fVar126 + fVar41) * fVar119) * fVar95;
            local_a48 = fVar120 - fVar27;
            fStack_a44 = fVar123 - fVar36;
            fStack_a40 = fVar125 - fVar38;
            fStack_a3c = fVar126 - fVar40;
            local_a58 = fVar100 - fVar50;
            fStack_a54 = fVar101 - fVar55;
            fStack_a50 = fVar102 - fVar56;
            fStack_a4c = fVar103 - fVar57;
            fVar80 = fVar108 - fVar76;
            fVar82 = fVar110 - fVar77;
            fVar83 = fVar112 - fVar78;
            fVar84 = fVar114 - fVar79;
            auVar71._0_4_ =
                 (local_a58 * (fVar108 + fVar76) - (fVar100 + fVar50) * fVar80) * fVar91 +
                 ((fVar120 + fVar27) * fVar80 - (fVar108 + fVar76) * local_a48) * fStack_ad0 +
                 (local_a48 * (fVar100 + fVar50) - (fVar120 + fVar27) * local_a58) * fVar95;
            auVar71._4_4_ =
                 (fStack_a54 * (fVar110 + fVar77) - (fVar101 + fVar55) * fVar82) * fVar91 +
                 ((fVar123 + fVar36) * fVar82 - (fVar110 + fVar77) * fStack_a44) * fStack_ad0 +
                 (fStack_a44 * (fVar101 + fVar55) - (fVar123 + fVar36) * fStack_a54) * fVar95;
            auVar71._8_4_ =
                 (fStack_a50 * (fVar112 + fVar78) - (fVar102 + fVar56) * fVar83) * fVar91 +
                 ((fVar125 + fVar38) * fVar83 - (fVar112 + fVar78) * fStack_a40) * fStack_ad0 +
                 (fStack_a40 * (fVar102 + fVar56) - (fVar125 + fVar38) * fStack_a50) * fVar95;
            auVar71._12_4_ =
                 (fStack_a4c * (fVar114 + fVar79) - (fVar103 + fVar57) * fVar84) * fVar91 +
                 ((fVar126 + fVar40) * fVar84 - (fVar114 + fVar79) * fStack_a3c) * fStack_ad0 +
                 (fStack_a3c * (fVar103 + fVar57) - (fVar126 + fVar40) * fStack_a4c) * fVar95;
            fVar109 = fVar27 - fVar28;
            fVar111 = fVar36 - fVar37;
            fVar113 = fVar38 - fVar39;
            fVar115 = fVar40 - fVar41;
            fVar121 = fVar50 - fVar59;
            fVar124 = fVar55 - fVar66;
            fStack_ae0 = fVar56 - fVar68;
            fStack_adc = fVar57 - fVar69;
            fVar98 = fVar76 - fVar92;
            fStack_af4 = fVar77 - fVar94;
            fStack_af0 = fVar78 - fVar96;
            fStack_aec = fVar79 - fVar97;
            auVar54._0_4_ =
                 (fVar121 * (fVar92 + fVar76) - (fVar59 + fVar50) * fVar98) * fVar91 +
                 ((fVar28 + fVar27) * fVar98 - (fVar92 + fVar76) * fVar109) * fStack_ad0 +
                 (fVar109 * (fVar59 + fVar50) - (fVar28 + fVar27) * fVar121) * fVar95;
            auVar54._4_4_ =
                 (fVar124 * (fVar94 + fVar77) - (fVar66 + fVar55) * fStack_af4) * fVar91 +
                 ((fVar37 + fVar36) * fStack_af4 - (fVar94 + fVar77) * fVar111) * fStack_ad0 +
                 (fVar111 * (fVar66 + fVar55) - (fVar37 + fVar36) * fVar124) * fVar95;
            auVar54._8_4_ =
                 (fStack_ae0 * (fVar96 + fVar78) - (fVar68 + fVar56) * fStack_af0) * fVar91 +
                 ((fVar39 + fVar38) * fStack_af0 - (fVar96 + fVar78) * fVar113) * fStack_ad0 +
                 (fVar113 * (fVar68 + fVar56) - (fVar39 + fVar38) * fStack_ae0) * fVar95;
            auVar54._12_4_ =
                 (fStack_adc * (fVar97 + fVar79) - (fVar69 + fVar57) * fStack_aec) * fVar91 +
                 ((fVar41 + fVar40) * fStack_aec - (fVar97 + fVar79) * fVar115) * fStack_ad0 +
                 (fVar115 * (fVar69 + fVar57) - (fVar41 + fVar40) * fStack_adc) * fVar95;
            fVar56 = auVar71._0_4_ + fVar42 + auVar54._0_4_;
            fVar57 = auVar71._4_4_ + fVar47 + auVar54._4_4_;
            fVar59 = auVar71._8_4_ + fVar48 + auVar54._8_4_;
            fVar66 = auVar71._12_4_ + fVar49 + auVar54._12_4_;
            auVar31._8_4_ = fVar48;
            auVar31._0_8_ = CONCAT44(fVar47,fVar42);
            auVar31._12_4_ = fVar49;
            auVar61 = minps(auVar31,auVar71);
            auVar61 = minps(auVar61,auVar54);
            auVar62._8_4_ = fVar48;
            auVar62._0_8_ = CONCAT44(fVar47,fVar42);
            auVar62._12_4_ = fVar49;
            auVar60 = maxps(auVar62,auVar71);
            auVar60 = maxps(auVar60,auVar54);
            fVar41 = ABS(fVar56) * 1.1920929e-07;
            fVar69 = ABS(fVar57) * 1.1920929e-07;
            fVar97 = ABS(fVar59) * 1.1920929e-07;
            fVar27 = ABS(fVar66) * 1.1920929e-07;
            auVar63._4_4_ = -(uint)(auVar60._4_4_ <= fVar69);
            auVar63._0_4_ = -(uint)(auVar60._0_4_ <= fVar41);
            auVar63._8_4_ = -(uint)(auVar60._8_4_ <= fVar97);
            auVar63._12_4_ = -(uint)(auVar60._12_4_ <= fVar27);
            auVar32._4_4_ = -(uint)(-fVar69 <= auVar61._4_4_);
            auVar32._0_4_ = -(uint)(-fVar41 <= auVar61._0_4_);
            auVar32._8_4_ = -(uint)(-fVar97 <= auVar61._8_4_);
            auVar32._12_4_ = -(uint)(-fVar27 <= auVar61._12_4_);
            auVar63 = auVar63 | auVar32;
            local_9c8 = auVar14._0_4_;
            uStack_9c4 = auVar14._4_4_;
            uStack_9c0 = auVar14._8_4_;
            uStack_9bc = auVar14._12_4_;
            auVar64._0_4_ = auVar63._0_4_ & local_9c8;
            auVar64._4_4_ = auVar63._4_4_ & uStack_9c4;
            auVar64._8_4_ = auVar63._8_4_ & uStack_9c0;
            auVar64._12_4_ = auVar63._12_4_ & uStack_9bc;
            iVar15 = movmskps((int)&local_b09,auVar64);
            fVar97 = local_a78;
            fVar69 = fStack_a74;
            fVar28 = fStack_a70;
            fVar36 = fStack_a6c;
            fVar27 = local_a88;
            fVar37 = fStack_a84;
            fVar38 = fStack_a80;
            fVar39 = fStack_a7c;
            fVar41 = local_a68;
            fVar40 = fStack_a64;
            fVar50 = fStack_a60;
            fVar55 = fStack_a5c;
            if (iVar15 != 0) {
              auVar81._0_4_ = local_a58 * fVar98 - fVar80 * fVar121;
              auVar81._4_4_ = fStack_a54 * fStack_af4 - fVar82 * fVar124;
              auVar81._8_4_ = fStack_a50 * fStack_af0 - fVar83 * fStack_ae0;
              auVar81._12_4_ = fStack_a4c * fStack_aec - fVar84 * fStack_adc;
              auVar33._4_4_ = -(uint)(ABS(fStack_a54 * fVar105) < ABS(fVar82 * fVar124));
              auVar33._0_4_ = -(uint)(ABS(local_a58 * fVar104) < ABS(fVar80 * fVar121));
              auVar33._8_4_ = -(uint)(ABS(fStack_a50 * fVar106) < ABS(fVar83 * fStack_ae0));
              auVar33._12_4_ = -(uint)(ABS(fStack_a4c * fVar107) < ABS(fVar84 * fStack_adc));
              auVar9._4_4_ = fVar117 * fVar82 - fStack_a54 * fVar105;
              auVar9._0_4_ = fVar116 * fVar80 - local_a58 * fVar104;
              auVar9._8_4_ = fVar118 * fVar83 - fStack_a50 * fVar106;
              auVar9._12_4_ = fVar119 * fVar84 - fStack_a4c * fVar107;
              local_808 = blendvps(auVar81,auVar9,auVar33);
              auVar99._0_4_ = fVar80 * fVar109 - local_a48 * fVar98;
              auVar99._4_4_ = fVar82 * fVar111 - fStack_a44 * fStack_af4;
              auVar99._8_4_ = fVar83 * fVar113 - fStack_a40 * fStack_af0;
              auVar99._12_4_ = fVar84 * fVar115 - fStack_a3c * fStack_aec;
              auVar34._4_4_ = -(uint)(ABS(fVar82 * fVar88) < ABS(fStack_a44 * fStack_af4));
              auVar34._0_4_ = -(uint)(ABS(fVar80 * fVar85) < ABS(local_a48 * fVar98));
              auVar34._8_4_ = -(uint)(ABS(fVar83 * fVar89) < ABS(fStack_a40 * fStack_af0));
              auVar34._12_4_ = -(uint)(ABS(fVar84 * fVar90) < ABS(fStack_a3c * fStack_aec));
              auVar8._4_4_ = fVar105 * fStack_a44 - fVar82 * fVar88;
              auVar8._0_4_ = fVar104 * local_a48 - fVar80 * fVar85;
              auVar8._8_4_ = fVar106 * fStack_a40 - fVar83 * fVar89;
              auVar8._12_4_ = fVar107 * fStack_a3c - fVar84 * fVar90;
              local_7f8 = blendvps(auVar99,auVar8,auVar34);
              auVar72._0_4_ = fVar85 * local_a58 - local_a48 * fVar116;
              auVar72._4_4_ = fVar88 * fStack_a54 - fStack_a44 * fVar117;
              auVar72._8_4_ = fVar89 * fStack_a50 - fStack_a40 * fVar118;
              auVar72._12_4_ = fVar90 * fStack_a4c - fStack_a3c * fVar119;
              auVar122._0_4_ = local_a48 * fVar121 - local_a58 * fVar109;
              auVar122._4_4_ = fStack_a44 * fVar124 - fStack_a54 * fVar111;
              auVar122._8_4_ = fStack_a40 * fStack_ae0 - fStack_a50 * fVar113;
              auVar122._12_4_ = fStack_a3c * fStack_adc - fStack_a4c * fVar115;
              auVar35._4_4_ = -(uint)(ABS(fStack_a44 * fVar117) < ABS(fStack_a54 * fVar111));
              auVar35._0_4_ = -(uint)(ABS(local_a48 * fVar116) < ABS(local_a58 * fVar109));
              auVar35._8_4_ = -(uint)(ABS(fStack_a40 * fVar118) < ABS(fStack_a50 * fVar113));
              auVar35._12_4_ = -(uint)(ABS(fStack_a3c * fVar119) < ABS(fStack_a4c * fVar115));
              local_7e8 = blendvps(auVar122,auVar72,auVar35);
              fVar68 = fVar91 * local_808._0_4_ +
                       fStack_ad0 * local_7f8._0_4_ + fVar95 * local_7e8._0_4_;
              fVar76 = fVar91 * local_808._4_4_ +
                       fStack_ad0 * local_7f8._4_4_ + fVar95 * local_7e8._4_4_;
              fVar77 = fVar91 * local_808._8_4_ +
                       fStack_ad0 * local_7f8._8_4_ + fVar95 * local_7e8._8_4_;
              fVar91 = fVar91 * local_808._12_4_ +
                       fStack_ad0 * local_7f8._12_4_ + fVar95 * local_7e8._12_4_;
              auVar86._0_4_ = fVar68 + fVar68;
              auVar86._4_4_ = fVar76 + fVar76;
              auVar86._8_4_ = fVar77 + fVar77;
              auVar86._12_4_ = fVar91 + fVar91;
              auVar46._0_4_ = fVar108 * local_7e8._0_4_;
              auVar46._4_4_ = fVar110 * local_7e8._4_4_;
              auVar46._8_4_ = fVar112 * local_7e8._8_4_;
              auVar46._12_4_ = fVar114 * local_7e8._12_4_;
              fVar77 = fVar120 * local_808._0_4_ + fVar100 * local_7f8._0_4_ + auVar46._0_4_;
              fVar78 = fVar123 * local_808._4_4_ + fVar101 * local_7f8._4_4_ + auVar46._4_4_;
              fVar79 = fVar125 * local_808._8_4_ + fVar102 * local_7f8._8_4_ + auVar46._8_4_;
              fVar80 = fVar126 * local_808._12_4_ + fVar103 * local_7f8._12_4_ + auVar46._12_4_;
              auVar61 = rcpps(auVar46,auVar86);
              fVar91 = auVar61._0_4_;
              fVar95 = auVar61._4_4_;
              fVar68 = auVar61._8_4_;
              fVar76 = auVar61._12_4_;
              local_818._0_4_ =
                   ((1.0 - auVar86._0_4_ * fVar91) * fVar91 + fVar91) * (fVar77 + fVar77);
              local_818._4_4_ =
                   ((1.0 - auVar86._4_4_ * fVar95) * fVar95 + fVar95) * (fVar78 + fVar78);
              local_818._8_4_ =
                   ((1.0 - auVar86._8_4_ * fVar68) * fVar68 + fVar68) * (fVar79 + fVar79);
              local_818._12_4_ =
                   ((1.0 - auVar86._12_4_ * fVar76) * fVar76 + fVar76) * (fVar80 + fVar80);
              fVar91 = ray->tfar;
              fVar95 = (ray->org).field_0.m128[3];
              auVar87._0_4_ =
                   (int)((uint)(auVar86._0_4_ != 0.0 &&
                               (local_818._0_4_ <= fVar91 && fVar95 <= local_818._0_4_)) *
                        -0x80000000) >> 0x1f;
              auVar87._4_4_ =
                   (int)((uint)(auVar86._4_4_ != 0.0 &&
                               (local_818._4_4_ <= fVar91 && fVar95 <= local_818._4_4_)) *
                        -0x80000000) >> 0x1f;
              auVar87._8_4_ =
                   (int)((uint)(auVar86._8_4_ != 0.0 &&
                               (local_818._8_4_ <= fVar91 && fVar95 <= local_818._8_4_)) *
                        -0x80000000) >> 0x1f;
              auVar87._12_4_ =
                   (int)((uint)(auVar86._12_4_ != 0.0 &&
                               (local_818._12_4_ <= fVar91 && fVar95 <= local_818._12_4_)) *
                        -0x80000000) >> 0x1f;
              iVar15 = movmskps((int)pNVar19,auVar87 & auVar64);
              pNVar19 = (NodeRef *)CONCAT44((int)((ulong)pNVar19 >> 0x20),iVar15);
              if (iVar15 != 0) {
                local_b08 = local_b08 + uVar21;
                auVar12._4_4_ = fVar57;
                auVar12._0_4_ = fVar56;
                auVar12._8_4_ = fVar59;
                auVar12._12_4_ = fVar66;
                local_ad8 = context->scene;
                auVar61 = rcpps(local_818,auVar12);
                fVar91 = auVar61._0_4_;
                fVar95 = auVar61._4_4_;
                fVar68 = auVar61._8_4_;
                fVar76 = auVar61._12_4_;
                fVar91 = (float)(-(uint)(1e-18 <= ABS(fVar56)) &
                                (uint)(((float)DAT_01feca10 - fVar56 * fVar91) * fVar91 + fVar91));
                fVar95 = (float)(-(uint)(1e-18 <= ABS(fVar57)) &
                                (uint)((DAT_01feca10._4_4_ - fVar57 * fVar95) * fVar95 + fVar95));
                fVar56 = (float)(-(uint)(1e-18 <= ABS(fVar59)) &
                                (uint)((DAT_01feca10._8_4_ - fVar59 * fVar68) * fVar68 + fVar68));
                fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar66)) &
                                (uint)((DAT_01feca10._12_4_ - fVar66 * fVar76) * fVar76 + fVar76));
                auVar73._0_4_ = fVar42 * fVar91;
                auVar73._4_4_ = fVar47 * fVar95;
                auVar73._8_4_ = fVar48 * fVar56;
                auVar73._12_4_ = fVar49 * fVar57;
                local_838 = minps(auVar73,_DAT_01feca10);
                auVar93._0_4_ = fVar91 * auVar71._0_4_;
                auVar93._4_4_ = fVar95 * auVar71._4_4_;
                auVar93._8_4_ = fVar56 * auVar71._8_4_;
                auVar93._12_4_ = fVar57 * auVar71._12_4_;
                local_828 = minps(auVar93,_DAT_01feca10);
                fStack_acc = fStack_ad0;
                do {
                  uVar23 = 0;
                  if (pNVar19 != (NodeRef *)0x0) {
                    for (; ((ulong)pNVar19 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  h.geomID = *(uint *)(local_b08 + 0x90 + uVar23 * 4);
                  pGVar6 = (local_ad8->geometries).items[h.geomID].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    pNVar19 = (NodeRef *)((ulong)pNVar19 ^ 1L << (uVar23 & 0x3f));
                    bVar13 = true;
                  }
                  else {
                    pRVar7 = context->args;
                    if ((pRVar7->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar13 = false;
                    }
                    else {
                      h.u = *(float *)(local_838 + uVar23 * 4);
                      h.v = *(float *)(local_828 + uVar23 * 4);
                      args.context = context->user;
                      h.primID = *(uint *)(local_b08 + 0xa0 + uVar23 * 4);
                      h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar23 * 4);
                      h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar23 * 4);
                      h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar23 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      local_af8 = ray->tfar;
                      ray->tfar = *(float *)(local_818 + uVar23 * 4);
                      local_afc = -1;
                      args.valid = &local_afc;
                      args.geometryUserPtr = pGVar6->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00223c6c:
                        if (pRVar7->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar7->filter)(&args);
                            fVar97 = local_a78;
                            fVar69 = fStack_a74;
                            fVar28 = fStack_a70;
                            fVar36 = fStack_a6c;
                            fVar27 = local_a88;
                            fVar37 = fStack_a84;
                            fVar38 = fStack_a80;
                            fVar39 = fStack_a7c;
                            fVar41 = local_a68;
                            fVar40 = fStack_a64;
                            fVar50 = fStack_a60;
                            fVar55 = fStack_a5c;
                          }
                          if (*args.valid == 0) goto LAB_00223cd8;
                        }
                        bVar13 = false;
                      }
                      else {
                        local_a48 = SUB84(context,0);
                        fStack_a44 = (float)((ulong)context >> 0x20);
                        local_a58 = SUB84(ray,0);
                        fStack_a54 = (float)((ulong)ray >> 0x20);
                        (*pGVar6->occlusionFilterN)(&args);
                        ray = (Ray *)CONCAT44(fStack_a54,local_a58);
                        context = (RayQueryContext *)CONCAT44(fStack_a44,local_a48);
                        fVar97 = local_a78;
                        fVar69 = fStack_a74;
                        fVar28 = fStack_a70;
                        fVar36 = fStack_a6c;
                        fVar27 = local_a88;
                        fVar37 = fStack_a84;
                        fVar38 = fStack_a80;
                        fVar39 = fStack_a7c;
                        fVar41 = local_a68;
                        fVar40 = fStack_a64;
                        fVar50 = fStack_a60;
                        fVar55 = fStack_a5c;
                        if (*args.valid != 0) goto LAB_00223c6c;
LAB_00223cd8:
                        ray->tfar = local_af8;
                        pNVar19 = (NodeRef *)((ulong)pNVar19 ^ 1L << (uVar23 & 0x3f));
                        bVar13 = true;
                      }
                    }
                  }
                  iVar15 = 0;
                  if (!bVar13) {
                    uVar23 = local_aa0;
                    uVar24 = local_a90;
                    uVar25 = local_a98;
                    if (bVar26) {
                      ray->tfar = -INFINITY;
                      iVar15 = 3;
                    }
                    goto LAB_00223d59;
                  }
                } while (pNVar19 != (NodeRef *)0x0);
                pNVar19 = (NodeRef *)0x0;
              }
            }
            iVar15 = 0;
            local_a30 = local_a30 + 1;
            bVar26 = local_a30 < local_ae8;
            uVar23 = local_aa0;
            uVar24 = local_a90;
            uVar25 = local_a98;
          } while (local_a30 != local_ae8);
        }
      }
LAB_00223d59:
    } while (iVar15 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }